

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

int P_Thing_CheckInputNum(player_t *p,int inputnum)

{
  DWORD local_18;
  int renum;
  int inputnum_local;
  player_t *p_local;
  
  local_18 = 0;
  if (p != (player_t *)0x0) {
    switch(inputnum) {
    case 0:
      local_18 = p->original_oldbuttons;
      break;
    case 1:
      local_18 = (p->original_cmd).buttons;
      break;
    case 2:
      local_18 = (DWORD)(p->original_cmd).pitch;
      break;
    case 3:
      local_18 = (DWORD)(p->original_cmd).yaw;
      break;
    case 4:
      local_18 = (DWORD)(p->original_cmd).roll;
      break;
    case 5:
      local_18 = (DWORD)(p->original_cmd).forwardmove;
      break;
    case 6:
      local_18 = (DWORD)(p->original_cmd).sidemove;
      break;
    case 7:
      local_18 = (DWORD)(p->original_cmd).upmove;
      break;
    case 8:
      local_18 = p->oldbuttons;
      break;
    case 9:
      local_18 = (p->cmd).ucmd.buttons;
      break;
    case 10:
      local_18 = (DWORD)(p->cmd).ucmd.pitch;
      break;
    case 0xb:
      local_18 = (DWORD)(p->cmd).ucmd.yaw;
      break;
    case 0xc:
      local_18 = (DWORD)(p->cmd).ucmd.roll;
      break;
    case 0xd:
      local_18 = (DWORD)(p->cmd).ucmd.forwardmove;
      break;
    case 0xe:
      local_18 = (DWORD)(p->cmd).ucmd.sidemove;
      break;
    case 0xf:
      local_18 = (DWORD)(p->cmd).ucmd.upmove;
      break;
    default:
      local_18 = 0;
    }
  }
  return local_18;
}

Assistant:

int P_Thing_CheckInputNum(player_t *p, int inputnum)
{
	int renum = 0;
	if (p)
	{
		switch (inputnum)
		{
		case INPUT_OLDBUTTONS:		renum = p->original_oldbuttons;			break;
		case INPUT_BUTTONS:			renum = p->original_cmd.buttons;		break;
		case INPUT_PITCH:			renum = p->original_cmd.pitch;			break;
		case INPUT_YAW:				renum = p->original_cmd.yaw;			break;
		case INPUT_ROLL:			renum = p->original_cmd.roll;			break;
		case INPUT_FORWARDMOVE:		renum = p->original_cmd.forwardmove;	break;
		case INPUT_SIDEMOVE:		renum = p->original_cmd.sidemove;		break;
		case INPUT_UPMOVE:			renum = p->original_cmd.upmove;			break;

		case MODINPUT_OLDBUTTONS:	renum = p->oldbuttons;					break;
		case MODINPUT_BUTTONS:		renum = p->cmd.ucmd.buttons;			break;
		case MODINPUT_PITCH:		renum = p->cmd.ucmd.pitch;				break;
		case MODINPUT_YAW:			renum = p->cmd.ucmd.yaw;				break;
		case MODINPUT_ROLL:			renum = p->cmd.ucmd.roll;				break;
		case MODINPUT_FORWARDMOVE:	renum = p->cmd.ucmd.forwardmove;		break;
		case MODINPUT_SIDEMOVE:		renum = p->cmd.ucmd.sidemove;			break;
		case MODINPUT_UPMOVE:		renum = p->cmd.ucmd.upmove;				break;

		default:					renum = 0;								break;
		}
	}
	return renum;
}